

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,void **vtt,char *name,bool quiet,Encoding encoding)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *m2;
  codecvt *this_00;
  locale local_50;
  locale local_48;
  locale local_40 [3];
  Encoding local_28;
  byte local_21;
  Encoding encoding_local;
  bool quiet_local;
  char *name_local;
  void **vtt_local;
  cmGeneratedFileStream *this_local;
  
  local_28 = encoding;
  local_21 = quiet;
  _encoding_local = name;
  name_local = (char *)vtt;
  vtt_local = (void **)this;
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(this,(char *)(vtt + 1),_Var2);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  bVar1 = std::ios::operator!((ios *)((long)&(this->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if (((bVar1 & 1) != 0) && ((local_21 & 1) == 0)) {
    m2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Cannot open file for write: ",m2,(char *)0x0,(char *)0x0);
    cmSystemTools::ReportLastSystemError("");
  }
  if (local_28 != None) {
    std::ios_base::getloc((ios_base *)&local_50);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,local_28);
    std::locale::locale<codecvt>(&local_48,&local_50,this_00);
    std::ios::imbue(local_40);
    std::locale::~locale(local_40);
    std::locale::~locale(&local_48);
    std::locale::~locale(&local_50);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(const char* name, bool quiet,
                                             Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(TempName.c_str())
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: ",
                         this->TempName.c_str());
    cmSystemTools::ReportLastSystemError("");
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}